

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O1

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<2048l>
          (fft<float,_2048L,_(re::fft::direction)1> *this,span<std::complex<float>,_2048L> out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _ComplexT _Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  lVar4 = 6;
  lVar5 = 5;
  lVar6 = 0x38;
  lVar7 = 0;
  do {
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x808 + lVar7);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[4]._M_value + lVar7 * 4);
    fVar9 = (float)uVar2;
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    fVar8 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar7) =
         CONCAT44(fVar11 * fVar8 + fVar10 * fVar9,fVar8 * fVar9 - fVar11 * fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1008 + lVar7);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[2]._M_value + lVar7 * 2);
    fVar9 = (float)uVar2;
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    fVar8 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar17 = fVar8 * fVar9 - fVar11 * fVar10;
    fVar15 = fVar11 * fVar8 + fVar10 * fVar9;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar7) = CONCAT44(fVar15,fVar17);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1808 + lVar7);
    _Var3 = (this->twiddles)._M_elems[lVar4]._M_value;
    fVar9 = (float)_Var3;
    fVar11 = (float)(_Var3 >> 0x20);
    fVar8 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar7) =
         CONCAT44(fVar11 * fVar8 + fVar10 * fVar9,fVar8 * fVar9 - fVar11 * fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2008 + lVar7);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[1]._M_value + lVar7);
    fVar9 = (float)uVar2;
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    fVar8 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar20 = fVar8 * fVar9 - fVar11 * fVar10;
    fVar19 = fVar11 * fVar8 + fVar10 * fVar9;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar7) = CONCAT44(fVar19,fVar20);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2808 + lVar7);
    _Var3 = (this->twiddles)._M_elems[lVar5]._M_value;
    fVar9 = (float)_Var3;
    fVar11 = (float)(_Var3 >> 0x20);
    fVar8 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar7) =
         CONCAT44(fVar11 * fVar8 + fVar10 * fVar9,fVar8 * fVar9 - fVar11 * fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3008 + lVar7);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar4 * 4);
    fVar8 = (float)uVar2;
    fVar10 = (float)((ulong)uVar2 >> 0x20);
    fVar9 = (float)uVar1;
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    fVar21 = fVar9 * fVar8 - fVar10 * fVar11;
    fVar12 = fVar10 * fVar9 + fVar11 * fVar8;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar7) = CONCAT44(fVar12,fVar21);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3808 + lVar7);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar6);
    fVar8 = (float)uVar2;
    fVar10 = (float)((ulong)uVar2 >> 0x20);
    fVar9 = (float)uVar1;
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) =
         CONCAT44(fVar10 * fVar9 + fVar11 * fVar8,fVar9 * fVar8 - fVar10 * fVar11);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 8 + lVar7);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x80c + lVar7);
    fVar11 = (float)uVar1;
    fVar14 = (float)((ulong)uVar1 >> 0x20);
    fVar13 = fVar8 + fVar11;
    fVar9 = fVar14 + fVar10;
    fVar11 = fVar11 - fVar8;
    fVar14 = fVar14 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar7) = CONCAT44(fVar9,fVar13);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar7) = CONCAT44(fVar14,fVar11);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x1808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x180c + lVar7);
    fVar18 = fVar17 - fVar8;
    fVar16 = fVar15 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar7) = CONCAT44(fVar15 + fVar10,fVar17 + fVar8)
    ;
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar7) = CONCAT44(fVar16,fVar18);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x2808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x280c + lVar7);
    fVar22 = fVar20 + fVar8;
    fVar24 = fVar19 + fVar10;
    fVar20 = fVar20 - fVar8;
    fVar19 = fVar19 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar7) = CONCAT44(fVar24,fVar22);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar7) = CONCAT44(fVar19,fVar20);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x3808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x380c + lVar7);
    fVar17 = fVar21 - fVar8;
    fVar15 = fVar12 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar7) = CONCAT44(fVar12 + fVar10,fVar21 + fVar8)
    ;
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) = CONCAT44(fVar15,fVar17);
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar7) = CONCAT44(fVar18,fVar16) ^ 0x80000000;
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar8 = (float)_Var3;
    fVar10 = (float)(_Var3 >> 0x20);
    fVar18 = fVar20 * fVar8 - fVar10 * fVar19;
    fVar12 = fVar10 * fVar20 + fVar19 * fVar8;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar7) = CONCAT44(fVar12,fVar18);
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar8 = (float)_Var3;
    fVar10 = (float)(_Var3 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) =
         CONCAT44(fVar17 * fVar8 - fVar10 * fVar15,fVar10 * fVar17 + fVar15 * fVar8) ^ 0x80000000;
    fVar8 = *(float *)((long)out.storage_.data_ + 0x1008 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x100c + lVar7);
    fVar16 = fVar13 + fVar8;
    fVar20 = fVar9 + fVar10;
    fVar13 = fVar13 - fVar8;
    fVar9 = fVar9 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar7) = CONCAT44(fVar20,fVar16);
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar7) = CONCAT44(fVar9,fVar13);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x1808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x180c + lVar7);
    fVar17 = fVar11 + fVar8;
    fVar21 = fVar14 + fVar10;
    fVar11 = fVar11 - fVar8;
    fVar14 = fVar14 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar7) = CONCAT44(fVar21,fVar17);
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar7) = CONCAT44(fVar14,fVar11);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x3008 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x300c + lVar7);
    fVar23 = fVar22 - fVar8;
    fVar25 = fVar24 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar7) = CONCAT44(fVar24 + fVar10,fVar22 + fVar8)
    ;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar7) = CONCAT44(fVar25,fVar23);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x3808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x380c + lVar7);
    fVar19 = fVar18 - fVar8;
    fVar15 = fVar12 - fVar10;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar7) = CONCAT44(fVar12 + fVar10,fVar18 + fVar8)
    ;
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) = CONCAT44(fVar15,fVar19);
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar7) = CONCAT44(fVar23,fVar25) ^ 0x80000000;
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) = CONCAT44(fVar19,fVar15) ^ 0x80000000;
    fVar8 = *(float *)((long)out.storage_.data_ + 0x2008 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x200c + lVar7);
    *(ulong *)((long)out.storage_.data_ + 8 + lVar7) = CONCAT44(fVar20 + fVar10,fVar16 + fVar8);
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar7) = CONCAT44(fVar20 - fVar10,fVar16 - fVar8)
    ;
    fVar8 = *(float *)((long)out.storage_.data_ + 0x2808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x280c + lVar7);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar7) = CONCAT44(fVar21 + fVar10,fVar17 + fVar8);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar7) = CONCAT44(fVar21 - fVar10,fVar17 - fVar8)
    ;
    fVar8 = *(float *)((long)out.storage_.data_ + 0x3008 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x300c + lVar7);
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar7) = CONCAT44(fVar9 + fVar10,fVar13 + fVar8);
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar7) = CONCAT44(fVar9 - fVar10,fVar13 - fVar8);
    fVar8 = *(float *)((long)out.storage_.data_ + 0x3808 + lVar7);
    fVar10 = *(float *)((long)out.storage_.data_ + 0x380c + lVar7);
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar7) = CONCAT44(fVar14 + fVar10,fVar11 + fVar8)
    ;
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar7) = CONCAT44(fVar14 - fVar10,fVar11 - fVar8)
    ;
    lVar4 = lVar4 + 6;
    lVar5 = lVar5 + 5;
    lVar6 = lVar6 + 0x38;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x7f8);
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }